

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

void exp_mod_precompute_window
               (mbedtls_mpi_uint *A,mbedtls_mpi_uint *N,size_t AN_limbs,mbedtls_mpi_uint mm,
               mbedtls_mpi_uint *RR,size_t welem,mbedtls_mpi_uint *Wtable,mbedtls_mpi_uint *temp)

{
  mbedtls_mpi_uint *in_RCX;
  long in_RDX;
  mbedtls_mpi_uint in_RSI;
  mbedtls_mpi_uint *in_RDI;
  mbedtls_mpi_uint *in_R8;
  mbedtls_mpi_uint *in_R9;
  undefined8 *in_stack_00000008;
  mbedtls_mpi_uint *Wcur;
  size_t i;
  mbedtls_mpi_uint *Wprev;
  mbedtls_mpi_uint *W1;
  size_t in_stack_ffffffffffffffb8;
  mbedtls_mpi_uint *AN_limbs_00;
  mbedtls_mpi_uint *in_stack_ffffffffffffffc0;
  mbedtls_mpi_uint *N_00;
  size_t in_stack_ffffffffffffffc8;
  mbedtls_mpi_uint *__dest;
  
  memset(in_stack_00000008,0,in_RDX << 3);
  *in_stack_00000008 = 1;
  mbedtls_mpi_core_montmul
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8,in_RSI,in_RDI);
  __dest = in_stack_00000008 + in_RDX;
  memcpy(__dest,in_RDI,in_RDX << 3);
  N_00 = __dest;
  for (AN_limbs_00 = (mbedtls_mpi_uint *)0x2; AN_limbs_00 < in_R9;
      AN_limbs_00 = (mbedtls_mpi_uint *)((long)AN_limbs_00 + 1)) {
    mbedtls_mpi_core_montmul
              (in_RCX,in_R8,in_R9,(size_t)__dest,N_00,(size_t)AN_limbs_00,in_RSI,in_RDI);
    N_00 = N_00 + in_RDX;
  }
  return;
}

Assistant:

static void exp_mod_precompute_window(const mbedtls_mpi_uint *A,
                                      const mbedtls_mpi_uint *N,
                                      size_t AN_limbs,
                                      mbedtls_mpi_uint mm,
                                      const mbedtls_mpi_uint *RR,
                                      size_t welem,
                                      mbedtls_mpi_uint *Wtable,
                                      mbedtls_mpi_uint *temp)
{
    /* W[0] = 1 (in Montgomery presentation) */
    memset(Wtable, 0, AN_limbs * ciL);
    Wtable[0] = 1;
    mbedtls_mpi_core_montmul(Wtable, Wtable, RR, AN_limbs, N, AN_limbs, mm, temp);

    /* W[1] = A (already in Montgomery presentation) */
    mbedtls_mpi_uint *W1 = Wtable + AN_limbs;
    memcpy(W1, A, AN_limbs * ciL);

    /* W[i+1] = W[i] * W[1], i >= 2 */
    mbedtls_mpi_uint *Wprev = W1;
    for (size_t i = 2; i < welem; i++) {
        mbedtls_mpi_uint *Wcur = Wprev + AN_limbs;
        mbedtls_mpi_core_montmul(Wcur, Wprev, W1, AN_limbs, N, AN_limbs, mm, temp);
        Wprev = Wcur;
    }
}